

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalhandler.cc
# Opt level: O3

void __thiscall
google::anon_unknown_0::MinimalFormatter::AppendUint64
          (MinimalFormatter *this,uint64 number,uint radix)

{
  char cVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  byte bVar4;
  byte bVar5;
  char *pcVar6;
  uint uVar7;
  ulong uVar8;
  char **__n;
  char **__buf;
  ulong uVar9;
  bool bVar10;
  char *local_18;
  char *local_10;
  
  uVar9 = CONCAT44(0,radix);
  uVar7 = 0;
  do {
    local_18 = this->cursor_;
    uVar8 = (ulong)uVar7;
    if (this->end_ <= local_18 + uVar8) goto LAB_00128dc7;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar9;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = number;
    bVar5 = SUB161(auVar3 % auVar2,0);
    bVar4 = bVar5 + 0x57;
    if (SUB168(auVar3 % auVar2,0) < 10) {
      bVar4 = bVar5 | 0x30;
    }
    uVar7 = uVar7 + 1;
    local_18[uVar8] = bVar4;
    bVar10 = uVar9 <= number;
    number = number / uVar9;
  } while (bVar10);
  local_18 = this->cursor_;
  uVar8 = (ulong)uVar7;
LAB_00128dc7:
  local_10 = local_18 + uVar8;
  if (local_18 == (char *)0x0 && uVar7 != 0) {
    __buf = &local_18;
    __n = &local_10;
    _GLOBAL__N_1::MinimalFormatter::AppendUint64();
    write(2,__buf,(size_t)__n);
    return;
  }
  if ((uVar7 != 0) && (local_10 = local_10 + -1, local_18 < local_10)) {
    do {
      pcVar6 = local_18 + 1;
      cVar1 = *local_18;
      *local_18 = *local_10;
      *local_10 = cVar1;
      local_10 = local_10 + -1;
      local_18 = pcVar6;
    } while (pcVar6 < local_10);
    local_18 = this->cursor_;
  }
  this->cursor_ = local_18 + uVar8;
  return;
}

Assistant:

void AppendUint64(uint64 number, unsigned radix) {
    unsigned i = 0;
    while (cursor_ + i < end_) {
      const uint64 tmp = number % radix;
      number /= radix;
      cursor_[i] = static_cast<char>(tmp < 10 ? '0' + tmp : 'a' + tmp - 10);
      ++i;
      if (number == 0) {
        break;
      }
    }
    // Reverse the bytes written.
    std::reverse(cursor_, cursor_ + i);
    cursor_ += i;
  }